

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseNode.h
# Opt level: O0

JITJavascriptString * __thiscall CaseNode::GetUpperBoundStringConstLocal(CaseNode *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *this_00;
  StackSym *this_01;
  void *var;
  JITJavascriptString *pJVar4;
  CaseNode *this_local;
  
  bVar2 = IsUpperBoundStrConst(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CaseNode.h"
                       ,0x34,"(IsUpperBoundStrConst())",
                       "Upper bound operand is not a string constant");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = GetUpperBound(this);
  this_01 = IR::Opnd::GetStackSym(this_00);
  var = StackSym::GetConstAddress(this_01,true);
  pJVar4 = JITJavascriptString::FromVar(var);
  return pJVar4;
}

Assistant:

JITJavascriptString* GetUpperBoundStringConstLocal()
    {
        AssertMsg(IsUpperBoundStrConst(), "Upper bound operand is not a string constant");
        return JITJavascriptString::FromVar(GetUpperBound()->GetStackSym()->GetConstAddress(true));
    }